

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_adj.c
# Opt level: O1

REF_STATUS ref_adj_degree(REF_ADJ ref_adj,REF_INT node,REF_INT *degree)

{
  REF_ADJ_ITEM pRVar1;
  int iVar2;
  int iVar3;
  
  *degree = 0;
  iVar2 = -1;
  if ((-1 < node) && (node < ref_adj->nnode)) {
    iVar2 = ref_adj->first[(uint)node];
  }
  if (iVar2 != -1) {
    pRVar1 = ref_adj->item;
    iVar3 = *degree;
    do {
      iVar3 = iVar3 + 1;
      *degree = iVar3;
      iVar2 = pRVar1[iVar2].next;
    } while (iVar2 != -1);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_adj_degree(REF_ADJ ref_adj, REF_INT node,
                                  REF_INT *degree) {
  REF_INT item;
  *degree = 0;

  for (item = ref_adj_first(ref_adj, node); ref_adj_valid(item);
       (item) = ref_adj_item_next(ref_adj, item))
    (*degree)++;

  return REF_SUCCESS;
}